

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

int __thiscall
mpt::type_properties<mpt::item<mpt::layout::graph::data>_>::_init
          (type_properties<mpt::item<mpt::layout::graph::data>_> *this,EVP_PKEY_CTX *ctx)

{
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    item<mpt::layout::graph::data>::item((item<mpt::layout::graph::data> *)this,(data *)0x0);
  }
  else {
    item<mpt::layout::graph::data>::item
              ((item<mpt::layout::graph::data> *)this,(item<mpt::layout::graph::data> *)ctx);
  }
  return 0;
}

Assistant:

static int _init(void *ptr, const void *src) {
		if (!src) {
			new (ptr) T();
		}
		else {
			new (ptr) T(*static_cast<const T *>(src));
		}
		return 0;
	}